

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O3

void __thiscall
dg::vr::ValueRelations::set<llvm::Value_const*,unsigned_long>
          (ValueRelations *this,Value **lt,Relations rels,unsigned_long *rt)

{
  Type TVar1;
  ulong *puVar2;
  ulong uVar3;
  Relations other;
  
  TVar1 = dg::vr::Relations::get();
  set<llvm::Value_const*,unsigned_long>(this,lt,TVar1,rt);
  if (((ulong)rels.bits.super__Base_bitset<1UL>._M_w & 0x330) != 0) {
    if (PF < TVar1) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)TVar1,
                 0xc);
    }
    puVar2 = (ulong *)dg::vr::Relations::addImplied();
    uVar3 = dg::vr::Relations::get();
    if ((*puVar2 >> (uVar3 & 0x3f) & 1) == 0) {
      TVar1 = dg::vr::Relations::get();
      set<llvm::Value_const*,unsigned_long>(this,lt,TVar1,rt);
    }
  }
  return;
}

Assistant:

void set(const X &lt, Relations rels, const Y &rt) {
        Relations::Type rel = rels.get();
        set(lt, rel, rt);
        Relations other = rels & Relations().ult().ule().ugt().uge();
        if (other.any() && !Relations().set(rel).addImplied().has(other.get()))
            set(lt, other.get(), rt);
    }